

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserMetadata.cpp
# Opt level: O0

void __thiscall
slang::parsing::anon_unknown_4::MetadataVisitor::handle
          (MetadataVisitor *this,InterfacePortHeaderSyntax *syntax)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  bool bVar1;
  vector<const_slang::syntax::InterfacePortHeaderSyntax_*,_std::allocator<const_slang::syntax::InterfacePortHeaderSyntax_*>_>
  *in_RDI;
  string_view sVar2;
  string_view name;
  value_type *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff98;
  Token *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  InterfacePortHeaderSyntax *in_stack_ffffffffffffffc8;
  SyntaxVisitor<slang::parsing::(anonymous_namespace)::MetadataVisitor> *this_00;
  undefined8 local_20;
  undefined8 local_18;
  
  sVar2 = Token::valueText(in_stack_ffffffffffffffa0);
  local_20 = (SyntaxVisitor<slang::parsing::(anonymous_namespace)::MetadataVisitor> *)sVar2._M_len;
  local_18 = sVar2._M_str;
  this_00 = local_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98);
  __x._M_str = in_stack_ffffffffffffffc0;
  __x._M_len = in_stack_ffffffffffffffb8;
  __y._M_str = in_stack_ffffffffffffffb0;
  __y._M_len = in_stack_ffffffffffffffa8;
  bVar1 = std::operator==(__x,__y);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff98);
    __x_00._M_str = in_stack_ffffffffffffffc0;
    __x_00._M_len = (size_t)local_18;
    __y_00._M_str = (char *)local_20;
    __y_00._M_len = in_stack_ffffffffffffffa8;
    bVar1 = std::operator==(__x_00,__y_00);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::
      vector<const_slang::syntax::InterfacePortHeaderSyntax_*,_std::allocator<const_slang::syntax::InterfacePortHeaderSyntax_*>_>
      ::push_back(in_RDI,in_stack_ffffffffffffff88);
    }
  }
  slang::syntax::SyntaxVisitor<slang::parsing::(anonymous_namespace)::MetadataVisitor>::
  visitDefault<slang::syntax::InterfacePortHeaderSyntax_const&>(this_00,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void handle(const InterfacePortHeaderSyntax& syntax) {
        std::string_view name = syntax.nameOrKeyword.valueText();
        if (name != "" && name != "interface")
            meta.interfacePorts.push_back(&syntax);
        visitDefault(syntax);
    }